

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<double>::Reserve(RepeatedField<double> *this,int new_size)

{
  int iVar1;
  Arena *this_00;
  double *pdVar2;
  double *pdVar3;
  void **ppvVar4;
  LogMessage *other;
  undefined8 *puVar5;
  int iVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->total_size_ < new_size) {
    if (this->total_size_ < 1) {
      pdVar2 = (double *)0x0;
    }
    else {
      pdVar2 = elements(this);
      pdVar2 = pdVar2 + -1;
    }
    if (this->total_size_ == 0) {
      ppvVar4 = &this->arena_or_elements_;
    }
    else {
      pdVar3 = elements(this);
      ppvVar4 = (void **)(pdVar3 + -1);
    }
    this_00 = (Arena *)*ppvVar4;
    iVar6 = 4;
    if (3 < new_size) {
      if (this->total_size_ < 0x40000000) {
        iVar6 = this->total_size_ * 2;
        if (iVar6 <= new_size) {
          iVar6 = new_size;
        }
      }
      else {
        if (new_size < 0x40000001) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x60e);
          other = internal::LogMessage::operator<<
                            (&local_68,
                             "CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ");
          internal::LogFinisher::operator=(&local_69,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        iVar6 = 0x7fffffff;
      }
    }
    if (this_00 == (Arena *)0x0) {
      puVar5 = (undefined8 *)operator_new((long)iVar6 * 8 + 8);
    }
    else {
      if (((byte)this_00[0x18] & 1) != 0) {
        Reserve();
      }
      puVar5 = (undefined8 *)Arena::AllocateAlignedNoHook(this_00,(long)iVar6 * 8 + 8);
    }
    *puVar5 = this_00;
    iVar1 = this->total_size_;
    this->total_size_ = iVar6;
    this->arena_or_elements_ = puVar5 + 1;
    elements(this);
    if (0 < this->current_size_) {
      pdVar3 = elements(this);
      memcpy(pdVar3,pdVar2 + 1,(long)this->current_size_ << 3);
    }
    if ((pdVar2 != (double *)0x0) && (*pdVar2 == 0.0)) {
      operator_delete(pdVar2,(long)iVar1 * 8 + 8);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}